

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O3

Var Js::JavascriptMath::AddLeftDead
              (Var aLeft,Var aRight,ScriptContext *scriptContext,JavascriptNumber *result)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  JavascriptString *pJVar8;
  Var pvVar9;
  JavascriptString *pstRight;
  char *message;
  char *error;
  uint lineNumber;
  char *fileName;
  double dVar10;
  double dVar11;
  
  if (aLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00a9d09d;
    *puVar6 = 0;
LAB_00a9ca8c:
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(aLeft);
    if (pRVar7 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00a9d09d;
      *puVar6 = 0;
    }
    TVar1 = ((pRVar7->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_String) {
        pJVar8 = UnsafeVarTo<Js::JavascriptString>(aLeft);
        if (aRight == (Var)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
          if (!bVar3) goto LAB_00a9d09d;
          *puVar6 = 0;
LAB_00a9cecd:
          pRVar7 = UnsafeVarTo<Js::RecyclableObject>(aRight);
          if (pRVar7 == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar6 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
            if (!bVar3) goto LAB_00a9d09d;
            *puVar6 = 0;
          }
          TVar1 = ((pRVar7->type).ptr)->typeId;
          if ((0x57 < (int)TVar1) && (BVar5 = RecyclableObject::IsExternal(pRVar7), BVar5 == 0)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar6 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar3) goto LAB_00a9d09d;
            *puVar6 = 0;
          }
          if (TVar1 != TypeIds_FirstNumberType) {
            if (TVar1 == TypeIds_Number) {
LAB_00a9d00b:
              if ((ulong)aRight >> 0x32 == 0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                *puVar6 = 1;
                bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                            ,0xd4,"(Is(aValue))",
                                            "Ensure var is actually a \'JavascriptNumber\'");
                if (!bVar3) goto LAB_00a9d09d;
                *puVar6 = 0;
              }
              pstRight = JavascriptNumber::ToStringRadix10
                                   ((double)((ulong)aRight ^ 0xfffc000000000000),scriptContext);
              goto LAB_00a9d087;
            }
            bVar3 = true;
            if (TVar1 == TypeIds_String) {
              pstRight = UnsafeVarTo<Js::JavascriptString>(aRight);
              goto LAB_00a9d087;
            }
            goto LAB_00a9cc21;
          }
        }
        else if (((ulong)aRight & 0x1ffff00000000) == 0x1000000000000 ||
                 ((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
          if (((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
            if ((ulong)aRight >> 0x32 == 0) goto LAB_00a9cecd;
            goto LAB_00a9d00b;
          }
        }
        else {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar3) goto LAB_00a9d09d;
          *puVar6 = 0;
        }
        pstRight = ScriptContext::GetIntegerString(scriptContext,aRight);
LAB_00a9d087:
        pJVar8 = JavascriptString::ConcatDestructive(pJVar8,pstRight);
        return pJVar8;
      }
    }
    else {
      BVar5 = RecyclableObject::IsExternal(pRVar7);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        fileName = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
        ;
        error = "(typeId < TypeIds_Limit || obj->IsExternal())";
        message = "GetTypeId aValue has invalid TypeId";
        lineNumber = 0xe;
        goto LAB_00a9cbff;
      }
    }
    bVar3 = false;
  }
  else {
    if (((ulong)aLeft & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)aLeft >> 0x32 == 0 && ((ulong)aLeft & 0xffff000000000000) != 0x1000000000000)
      goto LAB_00a9ca8c;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
      ;
      error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      lineNumber = 0x2a;
LAB_00a9cbff:
      bVar3 = Throw::ReportAssert(fileName,lineNumber,error,message);
      if (!bVar3) goto LAB_00a9d09d;
      *puVar6 = 0;
    }
    bVar3 = false;
  }
LAB_00a9cc21:
  if (((ulong)aLeft & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)aLeft & 0xffff000000000000) == 0x1000000000000) goto LAB_00a9ccac;
    if (((ulong)aRight & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)aRight & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_00a9d09d;
      *puVar6 = 0;
LAB_00a9cddc:
      if ((ulong)aLeft >> 0x32 == 0) goto LAB_00a9ce52;
      dVar11 = (double)((ulong)aLeft ^ 0xfffc000000000000);
      dVar10 = (double)(int)aRight;
      goto LAB_00a9ce33;
    }
    if (((ulong)aRight & 0xffff000000000000) == 0x1000000000000) goto LAB_00a9cddc;
    if ((ulong)aRight >> 0x32 == 0 || (ulong)aLeft >> 0x32 == 0) goto LAB_00a9ce52;
    dVar11 = (double)((ulong)aLeft ^ 0xfffc000000000000);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00a9d09d;
    *puVar6 = 0;
LAB_00a9ccac:
    if (((ulong)aRight & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)aRight & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) {
LAB_00a9d09d:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
LAB_00a9cd27:
      pvVar9 = TaggedInt::Add(aLeft,aRight,scriptContext);
      return pvVar9;
    }
    if (((ulong)aRight & 0xffff000000000000) == 0x1000000000000) goto LAB_00a9cd27;
    if ((ulong)aRight >> 0x32 == 0) {
LAB_00a9ce52:
      pvVar9 = Add_FullHelper_Wrapper(aLeft,aRight,scriptContext,result,bVar3);
      return pvVar9;
    }
    dVar11 = (double)(int)aLeft;
  }
  dVar10 = (double)((ulong)aRight ^ 0xfffc000000000000);
LAB_00a9ce33:
  pvVar9 = JavascriptNumber::ToVarMaybeInPlace(dVar10 + dVar11,scriptContext,result);
  return pvVar9;
}

Assistant:

Var JavascriptMath::AddLeftDead(Var aLeft, Var aRight, ScriptContext* scriptContext, JavascriptNumber *result)
        {
            // Conservatively assume src1 is not dead until proven otherwise.
            bool leftIsDead = false;

            JIT_HELPER_REENTRANT_HEADER(Op_AddLeftDead);
            if (JavascriptOperators::GetTypeId(aLeft) == TypeIds_String)
            {
                leftIsDead = true;

                JavascriptString* leftString = UnsafeVarTo<JavascriptString>(aLeft);
                JavascriptString* rightString;
                TypeId rightType = JavascriptOperators::GetTypeId(aRight);
                switch(rightType)
                {
                    case TypeIds_String:
                        rightString = UnsafeVarTo<JavascriptString>(aRight);

StringCommon:
                        return leftString->ConcatDestructive(rightString);

                    case TypeIds_Integer:
                        rightString = scriptContext->GetIntegerString(aRight);
                        goto StringCommon;

                    case TypeIds_Number:
                        rightString = JavascriptNumber::ToStringRadix10(JavascriptNumber::GetValue(aRight), scriptContext);
                        goto StringCommon;
                }
            }

            if (TaggedInt::Is(aLeft))
            {
                if (TaggedInt::Is(aRight))
                {
                    return TaggedInt::Add(aLeft, aRight, scriptContext);
                }
                else if (JavascriptNumber::Is_NoTaggedIntCheck(aRight))
                {
                    return JavascriptNumber::ToVarMaybeInPlace(TaggedInt::ToDouble(aLeft) + JavascriptNumber::GetValue(aRight), scriptContext, result);
                }
            }
            else if (TaggedInt::Is(aRight))
            {
                if (JavascriptNumber::Is_NoTaggedIntCheck(aLeft))
                {
                    return JavascriptNumber::ToVarMaybeInPlace(JavascriptNumber::GetValue(aLeft) + TaggedInt::ToDouble(aRight), scriptContext, result);
                }
            }
            else if (JavascriptNumber::Is_NoTaggedIntCheck(aLeft) && JavascriptNumber::Is_NoTaggedIntCheck(aRight))
            {
                return JavascriptNumber::ToVarMaybeInPlace(JavascriptNumber::GetValue(aLeft) + JavascriptNumber::GetValue(aRight), scriptContext, result);
            }
            return Add_FullHelper_Wrapper(aLeft, aRight, scriptContext, result, leftIsDead);
            JIT_HELPER_END(Op_AddLeftDead);
        }